

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

value * __thiscall
mjs::interpreter::impl::operator()(value *__return_storage_ptr__,impl *this,binary_expression *e)

{
  bool bVar1;
  int iVar2;
  token_type tVar3;
  void *pvVar4;
  object *this_00;
  uint *puVar5;
  long *plVar6;
  void *pvVar7;
  undefined8 *puVar8;
  wostream *pwVar9;
  char *pcVar10;
  native_error_exception *pnVar11;
  value o;
  value l;
  value r;
  value l_1;
  undefined1 local_2a8 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_2a0;
  undefined1 local_280 [40];
  gc_heap_ptr_untyped local_258 [2];
  undefined1 local_238 [40];
  wstring_view local_210 [2];
  wstring_view local_1f0;
  undefined1 local_1e0 [376];
  wstring_view local_68;
  value local_58;
  
  if (e->op_ == comma) {
    eval((value *)local_1e0,this,
         (e->lhs_)._M_t.
         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
         super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    get_value(&local_58,this,(value *)local_1e0);
    value::destroy(&local_58);
    value::destroy((value *)local_1e0);
    eval((value *)local_1e0,this,
         (e->rhs_)._M_t.
         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
         super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    get_value(__return_storage_ptr__,this,(value *)local_1e0);
    value::destroy((value *)local_1e0);
    return __return_storage_ptr__;
  }
  iVar2 = operator_precedence(e->op_);
  if (iVar2 == 0xf) {
    eval((value *)local_1e0,this,
         (e->lhs_)._M_t.
         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
         super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    eval((value *)(local_280 + 0x20),this,
         (e->rhs_)._M_t.
         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
         super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    get_value(__return_storage_ptr__,this,(value *)(local_280 + 0x20));
    value::destroy((value *)(local_280 + 0x20));
    if (e->op_ != equal) {
      get_value((value *)(local_280 + 0x20),this,(value *)local_1e0);
      tVar3 = without_assignment(e->op_);
      do_binary_op((value *)local_238,this,tVar3,(value *)(local_280 + 0x20),__return_storage_ptr__)
      ;
      value::operator=(__return_storage_ptr__,(value *)local_238);
      value::destroy((value *)local_238);
      value::destroy((value *)(local_280 + 0x20));
    }
    put_value(this,(value *)local_1e0,__return_storage_ptr__);
    value::destroy((value *)local_1e0);
    return __return_storage_ptr__;
  }
  eval((value *)local_1e0,this,
       (e->lhs_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
       _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
       super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
  get_value((value *)(local_280 + 0x20),this,(value *)local_1e0);
  value::destroy((value *)local_1e0);
  tVar3 = e->op_;
  if (tVar3 == andand) {
    bVar1 = to_boolean((value *)(local_280 + 0x20));
    if (bVar1) {
      tVar3 = e->op_;
      goto LAB_001255e9;
    }
  }
  else {
LAB_001255e9:
    if ((tVar3 != oror) || (bVar1 = to_boolean((value *)(local_280 + 0x20)), !bVar1)) {
      eval((value *)local_1e0,this,
           (e->rhs_)._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
      get_value((value *)local_238,this,(value *)local_1e0);
      value::destroy((value *)local_1e0);
      tVar3 = e->op_;
      if (tVar3 - andand < 2) {
        value::value(__return_storage_ptr__,(value *)local_238);
      }
      else if ((int)tVar3 < 0x52) {
        if ((tVar3 == dot) || (tVar3 == lbracket)) {
          make_reference(__return_storage_ptr__,this,(value *)(local_280 + 0x20),(value *)local_238)
          ;
        }
        else {
LAB_001256ce:
          do_binary_op(__return_storage_ptr__,this,tVar3,(value *)(local_280 + 0x20),
                       (value *)local_238);
        }
      }
      else if (tVar3 == in_) {
        if (local_238._0_4_ != object) {
          std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1e0);
          pcVar10 = string_value(local_238._0_4_);
          pwVar9 = std::operator<<((wostream *)local_1e0,pcVar10);
          std::operator<<(pwVar9," is not an object");
          pnVar11 = (native_error_exception *)__cxa_allocate_exception(0x58);
          stack_trace_abi_cxx11_((wstring *)local_2a8,this);
          local_210[0]._M_len = (size_t)local_2a0.n_;
          std::__cxx11::wstringbuf::str();
          local_1f0._M_str = (wchar_t *)local_280._0_8_;
          native_error_exception::native_error_exception(pnVar11,type,local_210,&local_1f0);
          __cxa_throw(pnVar11,&native_error_exception::typeinfo,
                      native_error_exception::~native_error_exception);
        }
        this_00 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_238 + 8));
        to_string((mjs *)local_2a8,this->heap_,(value *)(local_280 + 0x20));
        puVar5 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8);
        local_1e0._8_8_ = puVar5 + 1;
        local_1e0._0_8_ = ZEXT48(*puVar5);
        bVar1 = object::has_property(this_00,(wstring_view *)local_1e0);
        __return_storage_ptr__->type_ = boolean;
        (__return_storage_ptr__->field_1).b_ = bVar1;
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_2a8);
      }
      else {
        if (tVar3 != instanceof_) goto LAB_001256ce;
        if (local_238._0_4_ != object) {
LAB_00125955:
          std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1e0);
          pcVar10 = string_value(local_238._0_4_);
          pwVar9 = std::operator<<((wostream *)local_1e0,pcVar10);
          std::operator<<(pwVar9," is not an object");
          pnVar11 = (native_error_exception *)__cxa_allocate_exception(0x58);
          stack_trace_abi_cxx11_((wstring *)local_2a8,this);
          local_210[0]._M_len = (size_t)local_2a0.n_;
          std::__cxx11::wstringbuf::str();
          local_1f0._M_str = (wchar_t *)local_280._0_8_;
          native_error_exception::native_error_exception(pnVar11,type,local_210,&local_1f0);
          __cxa_throw(pnVar11,&native_error_exception::typeinfo,
                      native_error_exception::~native_error_exception);
        }
        pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_238 + 8));
        if (*(int *)((long)pvVar4 + 0x14) == 0) {
          local_1e0._0_8_ = (gc_heap *)0x0;
          local_1e0._8_8_ = local_1e0._8_8_ & 0xffffffff00000000;
        }
        else {
          gc_heap::unsafe_create_from_position<mjs::object>
                    ((gc_heap *)local_1e0,(uint32_t)*(undefined8 *)((long)pvVar4 + 8));
        }
        pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_1e0);
        plVar6 = (long *)gc_heap_ptr_untyped::get(&(this->global_).super_gc_heap_ptr_untyped);
        (**(code **)(*plVar6 + 0x60))(local_2a8,plVar6);
        pvVar7 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2a8);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_2a8);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1e0);
        if (pvVar4 != pvVar7) goto LAB_00125955;
        if (local_280._32_4_ == 5) {
          if (local_238._0_4_ != object) {
LAB_00125936:
            __assert_fail("type_ == value_type::object",
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h"
                          ,0x46,"const object_ptr &mjs::value::object_value() const");
          }
          puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_238 + 8));
          local_1e0._0_8_ = (gc_heap *)0x9;
          local_1e0._8_8_ = L"prototype";
          (**(code **)*puVar8)(local_2a8,puVar8);
          if (local_2a8._0_4_ != object) {
            std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1e0);
            pwVar9 = std::operator<<((wostream *)local_1e0,
                                     "Function has non-object prototype of type ");
            pcVar10 = string_value(local_2a8._0_4_);
            pwVar9 = std::operator<<(pwVar9,pcVar10);
            std::operator<<(pwVar9," in instanceof check");
            pnVar11 = (native_error_exception *)__cxa_allocate_exception(0x58);
            stack_trace_abi_cxx11_((wstring *)local_280,this);
            local_1f0._M_str = (wchar_t *)local_280._0_8_;
            std::__cxx11::wstringbuf::str();
            local_68._M_len = (size_t)local_210[0]._M_str;
            local_68._M_str = (wchar_t *)local_210[0]._M_len;
            native_error_exception::native_error_exception(pnVar11,type,&local_1f0,&local_68);
            __cxa_throw(pnVar11,&native_error_exception::typeinfo,
                        native_error_exception::~native_error_exception);
          }
          if (local_280._32_4_ != 5) goto LAB_00125936;
          pvVar4 = gc_heap_ptr_untyped::get(local_258);
          if (*(int *)((long)pvVar4 + 0x14) == 0) {
            local_1e0._0_8_ = (gc_heap *)0x0;
            local_1e0._8_8_ = local_1e0._8_8_ & 0xffffffff00000000;
          }
          else {
            gc_heap::unsafe_create_from_position<mjs::object>
                      ((gc_heap *)local_1e0,(uint32_t)*(undefined8 *)((long)pvVar4 + 8));
            if ((gc_heap *)local_1e0._0_8_ != (gc_heap *)0x0) {
              do {
                pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_1e0);
                if (local_2a8._0_4_ != object) goto LAB_00125936;
                pvVar7 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_2a8 + 8));
                if (pvVar4 == pvVar7) {
                  bVar1 = true;
                  goto LAB_001258eb;
                }
                pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_1e0);
                if (*(int *)((long)pvVar4 + 0x14) == 0) {
                  local_280._0_8_ = (gc_heap_ptr_untyped **)0x0;
                  local_280._8_4_ = 0;
                }
                else {
                  gc_heap::unsafe_create_from_position<mjs::object>
                            ((gc_heap *)local_280,(uint32_t)*(undefined8 *)((long)pvVar4 + 8));
                }
                gc_heap_ptr_untyped::operator=
                          ((gc_heap_ptr_untyped *)local_1e0,(gc_heap_ptr_untyped *)local_280);
                gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_280);
              } while ((gc_heap *)local_1e0._0_8_ != (gc_heap *)0x0);
            }
          }
          bVar1 = false;
LAB_001258eb:
          __return_storage_ptr__->type_ = boolean;
          (__return_storage_ptr__->field_1).b_ = bVar1;
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1e0);
          value::destroy((value *)local_2a8);
        }
        else {
          __return_storage_ptr__->type_ = boolean;
          (__return_storage_ptr__->field_1).b_ = false;
        }
      }
      value::destroy((value *)local_238);
      goto LAB_00125913;
    }
  }
  value::value(__return_storage_ptr__,(value *)(local_280 + 0x20));
LAB_00125913:
  value::destroy((value *)(local_280 + 0x20));
  return __return_storage_ptr__;
}

Assistant:

value operator()(const binary_expression& e) {
        if (e.op() == token_type::comma) {
            (void)get_value(eval(e.lhs()));;
            return get_value(eval(e.rhs()));
        }
        if (operator_precedence(e.op()) == assignment_precedence) {
            auto l = eval(e.lhs());
            auto r = get_value(eval(e.rhs()));
            if (e.op() != token_type::equal) {
                auto lval = get_value(l);
                r = do_binary_op(without_assignment(e.op()), lval, r);
            }
            put_value(l, r);
            return r;
        }

        auto l = get_value(eval(e.lhs()));
        if ((e.op() == token_type::andand && !to_boolean(l)) || (e.op() == token_type::oror && to_boolean(l))) {
            return l;
        }
        auto r = get_value(eval(e.rhs()));
        if (e.op() == token_type::andand || e.op() == token_type::oror) {
            return r;
        } else if (is_reference_op(e.op())) {
            return make_reference(l, r);
        } else if (e.op() == token_type::in_) {
            if (r.type() != value_type::object) {
                std::wostringstream woss;
                woss << r.type() << " is not an object";
                throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
            }
            return value{r.object_value()->has_property(to_string(heap_, l).view())};
        } else if (e.op() == token_type::instanceof_) {
            if (r.type() != value_type::object || r.object_value()->prototype().get() != global_->function_prototype().get()) {
                std::wostringstream woss;
                woss << r.type() << " is not an object";
                throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
            }
            // ES3, 15.3.5.3 [[HasInstance]] (only implemented for Function objects)
            if (l.type() != value_type::object) {
                return value{false};
            }
            auto o = r.object_value()->get(L"prototype");
            if (o.type() != value_type::object) {
                std::wostringstream woss;
                woss << "Function has non-object prototype of type " << o.type() << " in instanceof check";
                throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
            }
            auto v = l.object_value()->prototype();
            for (;;) {
                if (!v) {
                    return value{false};
                }
                if (v.get() == o.object_value().get()) { // TODO: handle joined objects (ES3, 13.1.2)
                    return value{true};
                }
                v = v->prototype();
            }

        }
        return do_binary_op(e.op(), l, r);
    }